

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O2

void __thiscall QO_Manager::~QO_Manager(QO_Manager *this)

{
  vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
  *this_00;
  _Base_ptr p_Var1;
  pointer pmVar2;
  _Base_ptr p_Var3;
  int i;
  long lVar4;
  
  this_00 = &this->optcost;
  for (lVar4 = 0; lVar4 < this->nRels; lVar4 = lVar4 + 1) {
    pmVar2 = (this_00->
             super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var3 = *(_Base_ptr *)((long)&pmVar2[lVar4]._M_t._M_impl.super__Rb_tree_header + 0x10);
    while (p_Var3 != &pmVar2[lVar4]._M_t._M_impl.super__Rb_tree_header._M_header) {
      p_Var1 = p_Var3[1]._M_parent;
      if (p_Var1 != (_Base_ptr)0x0) {
        std::
        _Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                     *)&p_Var1->_M_right);
      }
      operator_delete(p_Var1);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      pmVar2 = (this_00->
               super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
  }
  std::
  vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
  ::~vector(this_00);
  return;
}

Assistant:

QO_Manager::~QO_Manager(){
  for(int i=0; i < nRels; i++){
    map<int, costElem*>::iterator it;
    for(it= optcost[i].begin(); it != optcost[i].end(); ++it){
      delete it->second;
    }
  }
}